

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void MOJOSHADER_freeEffect(MOJOSHADER_effect *_effect)

{
  MOJOSHADER_free f_00;
  void *d_00;
  MOJOSHADER_effectParam *value;
  MOJOSHADER_effectTechnique *pMVar1;
  MOJOSHADER_effectPass *pMVar2;
  MOJOSHADER_effectObject *pMVar3;
  MOJOSHADER_effectObject *object;
  MOJOSHADER_effectPass *pass;
  MOJOSHADER_effectTechnique *technique;
  MOJOSHADER_effectParam *param;
  uint local_30;
  int k;
  int j;
  int i;
  void *d;
  MOJOSHADER_free f;
  MOJOSHADER_effect *effect;
  MOJOSHADER_effect *_effect_local;
  
  if ((_effect != (MOJOSHADER_effect *)0x0) && (_effect != &MOJOSHADER_out_of_mem_effect)) {
    f_00 = _effect->free;
    d_00 = _effect->malloc_data;
    for (k = 0; k < _effect->error_count; k = k + 1) {
      (*f_00)(_effect->errors[k].error,d_00);
      (*f_00)(_effect->errors[k].filename,d_00);
    }
    (*f_00)(_effect->errors,d_00);
    (*f_00)(_effect->profile,d_00);
    for (k = 0; k < _effect->param_count; k = k + 1) {
      value = _effect->params + k;
      freevalue(&value->value,f_00,d_00);
      for (local_30 = 0; local_30 < value->annotation_count; local_30 = local_30 + 1) {
        freevalue(value->annotations + (int)local_30,f_00,d_00);
      }
      (*f_00)(value->annotations,d_00);
    }
    (*f_00)(_effect->params,d_00);
    for (k = 0; k < _effect->technique_count; k = k + 1) {
      pMVar1 = _effect->techniques + k;
      (*f_00)(pMVar1->name,d_00);
      for (local_30 = 0; local_30 < pMVar1->pass_count; local_30 = local_30 + 1) {
        pMVar2 = pMVar1->passes + (int)local_30;
        (*f_00)(pMVar2->name,d_00);
        for (param._4_4_ = 0; param._4_4_ < pMVar2->state_count; param._4_4_ = param._4_4_ + 1) {
          freevalue(&pMVar2->states[(int)param._4_4_].value,f_00,d_00);
        }
        (*f_00)(pMVar2->states,d_00);
        for (param._4_4_ = 0; param._4_4_ < pMVar2->annotation_count; param._4_4_ = param._4_4_ + 1)
        {
          freevalue(pMVar2->annotations + (int)param._4_4_,f_00,d_00);
        }
        (*f_00)(pMVar2->annotations,d_00);
      }
      (*f_00)(pMVar1->passes,d_00);
      for (local_30 = 0; local_30 < pMVar1->annotation_count; local_30 = local_30 + 1) {
        freevalue(pMVar1->annotations + (int)local_30,f_00,d_00);
      }
      (*f_00)(pMVar1->annotations,d_00);
    }
    (*f_00)(_effect->techniques,d_00);
    for (k = 0; k < _effect->object_count; k = k + 1) {
      pMVar3 = _effect->objects + k;
      if ((pMVar3->type == MOJOSHADER_SYMTYPE_PIXELSHADER) ||
         (pMVar3->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
        if (*(int *)((long)pMVar3 + 0xc) == 0) {
          MOJOSHADER_freeParseData(*(MOJOSHADER_parseData **)((long)pMVar3 + 0x40));
        }
        else {
          MOJOSHADER_freePreshader(*(MOJOSHADER_preshader **)((long)pMVar3 + 0x40));
        }
        (*f_00)(*(void **)((long)pMVar3 + 0x28),d_00);
        (*f_00)(*(void **)((long)pMVar3 + 0x38),d_00);
        (*f_00)(*(void **)((long)pMVar3 + 0x18),d_00);
      }
      else if ((((pMVar3->type == MOJOSHADER_SYMTYPE_SAMPLER) ||
                (pMVar3->type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
               (pMVar3->type == MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
              ((pMVar3->type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
               (pMVar3->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))) {
        (*f_00)(*(void **)((long)pMVar3 + 8),d_00);
      }
      else if (pMVar3->type == MOJOSHADER_SYMTYPE_STRING) {
        (*f_00)(*(void **)((long)pMVar3 + 8),d_00);
      }
    }
    (*f_00)(_effect->objects,d_00);
    (*f_00)(_effect,d_00);
  }
  return;
}

Assistant:

void MOJOSHADER_freeEffect(const MOJOSHADER_effect *_effect)
{
    MOJOSHADER_effect *effect = (MOJOSHADER_effect *) _effect;
    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return;  // no-op.

    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int i, j, k;

    /* Free errors */
    for (i = 0; i < effect->error_count; i++)
    {
        f((void *) effect->errors[i].error, d);
        f((void *) effect->errors[i].filename, d);
    } // for
    f((void *) effect->errors, d);

    /* Free profile string */
    f((void *) effect->profile, d);

    /* Free parameters, including annotations */
    for (i = 0; i < effect->param_count; i++)
    {
        MOJOSHADER_effectParam *param = &effect->params[i];
        freevalue(&param->value, f, d);
        for (j = 0; j < param->annotation_count; j++)
        {
            freevalue(&param->annotations[j], f, d);
        } // for
        f((void *) param->annotations, d);
    } // for
    f((void *) effect->params, d);

    /* Free techniques, including passes and all annotations */
    for (i = 0; i < effect->technique_count; i++)
    {
        MOJOSHADER_effectTechnique *technique = &effect->techniques[i];
        f((void *) technique->name, d);
        for (j = 0; j < technique->pass_count; j++)
        {
            MOJOSHADER_effectPass *pass = &technique->passes[j];
            f((void *) pass->name, d);
            for (k = 0; k < pass->state_count; k++)
            {
                freevalue(&pass->states[k].value, f, d);
            } // for
            f((void *) pass->states, d);
            for (k = 0; k < pass->annotation_count; k++)
            {
                freevalue(&pass->annotations[k], f, d);
            } // for
            f((void *) pass->annotations, d);
        } // for
        f((void *) technique->passes, d);
        for (j = 0; j < technique->annotation_count; j++)
        {
            freevalue(&technique->annotations[j], f, d);
        } // for
        f((void *) technique->annotations, d);
    } // for
    f((void *) effect->techniques, d);

    /* Free object table */
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                MOJOSHADER_freePreshader(object->shader.preshader);
            else
                MOJOSHADER_freeParseData(object->shader.shader);
            f((void *) object->shader.params, d);
            f((void *) object->shader.samplers, d);
            f((void *) object->shader.preshader_params, d);
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
            f((void *) object->mapping.name, d);
        else if (object->type == MOJOSHADER_SYMTYPE_STRING)
            f((void *) object->string.string, d);
    } // for
    f((void *) effect->objects, d);

    /* Free base effect structure */
    f((void *) effect, d);
}